

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

int Saig_ManBmcCreateCnf(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  Vec_Wec_t *p_00;
  Aig_Man_t *pAVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *p_01;
  Aig_Obj_t *pAVar6;
  int iVar7;
  
  iVar2 = Saig_ManBmcRunTerSim_rec(p,pObj,iFrame);
  if (iVar2 == 3) {
    p_00 = p->vVisited;
    for (iVar2 = 0; iVar2 < p_00->nSize; iVar2 = iVar2 + 1) {
      pVVar5 = Vec_WecEntry(p_00,iVar2);
      pVVar5->nSize = 0;
    }
    p_00->nSize = 0;
    pVVar5 = Vec_WecPushLevel(p->vVisited);
    Vec_IntPush(pVVar5,pObj->Id);
    iVar2 = iFrame;
    do {
      if (iVar2 < 0) break;
      Aig_ManIncrementTravId(p->pAig);
      pVVar5 = Vec_WecPushLevel(p->vVisited);
      p_01 = Vec_WecEntry(p->vVisited,p->vVisited->nSize + -2);
      for (iVar7 = 0; iVar7 < p_01->nSize; iVar7 = iVar7 + 1) {
        pAVar1 = p->pAig;
        iVar3 = Vec_IntEntry(p_01,iVar7);
        pAVar6 = Aig_ManObj(pAVar1,iVar3);
        Saig_ManBmcCreateCnf_iter(p,pAVar6,iVar2,pVVar5);
      }
      iVar2 = iVar2 + -1;
    } while (pVVar5->nSize != 0);
    iVar2 = p->vVisited->nSize;
    while (0 < iVar2) {
      iVar2 = iVar2 + -1;
      pVVar5 = Vec_WecEntry(p->vVisited,iVar2);
      for (iVar7 = 0; iVar7 < pVVar5->nSize; iVar7 = iVar7 + 1) {
        pAVar1 = p->pAig;
        iVar3 = Vec_IntEntry(pVVar5,iVar7);
        pAVar6 = Aig_ManObj(pAVar1,iVar3);
        Saig_ManBmcCreateCnf_rec(p,pAVar6,iFrame - iVar2);
      }
    }
    uVar4 = Saig_ManBmcLiteral(p,pObj,iFrame);
    if (p->pSat2 == (solver_t *)0x0) {
      if (p->pSat3 == (bmcg_sat_solver *)0x0) {
        sat_solver_setnvars(p->pSat,p->nSatVars);
      }
      else {
        for (iVar2 = bmcg_sat_solver_varnum(p->pSat3); iVar2 < p->nSatVars; iVar2 = iVar2 + 1) {
          bmcg_sat_solver_addvar(p->pSat3);
        }
      }
    }
    else {
      satoko_setnvars(p->pSat2,p->nSatVars);
    }
  }
  else {
    uVar4 = (uint)(iVar2 == 2);
  }
  return uVar4;
}

Assistant:

int Saig_ManBmcCreateCnf( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    Vec_Int_t * vVisit, * vVisit2;
    Aig_Obj_t * pTemp;
    int Lit, f, i;
    // perform ternary simulation
    int Value = Saig_ManBmcRunTerSim_rec( p, pObj, iFrame );
    if ( Value != SAIG_TER_UND )
        return (int)(Value == SAIG_TER_ONE);
    // construct CNF if value is ternary
//    Lit = Saig_ManBmcCreateCnf_rec( p, pObj, iFrame );
    Vec_WecClear( p->vVisited );
    vVisit = Vec_WecPushLevel( p->vVisited );
    Vec_IntPush( vVisit, Aig_ObjId(pObj) );
    for ( f = iFrame; f >= 0; f-- )
    {
        Aig_ManIncrementTravId( p->pAig );
        vVisit2 = Vec_WecPushLevel( p->vVisited );
        vVisit = Vec_WecEntry( p->vVisited, Vec_WecSize(p->vVisited)-2 );
        Aig_ManForEachObjVec( vVisit, p->pAig, pTemp, i )
            Saig_ManBmcCreateCnf_iter( p, pTemp, f, vVisit2 );
        if ( Vec_IntSize(vVisit2) == 0 )
            break;
    }
    Vec_WecForEachLevelReverse( p->vVisited, vVisit, f )
        Aig_ManForEachObjVec( vVisit, p->pAig, pTemp, i )
            Saig_ManBmcCreateCnf_rec( p, pTemp, iFrame-f );
    Lit = Saig_ManBmcLiteral( p, pObj, iFrame );
    // extend the SAT solver
    if ( p->pSat2 )
        satoko_setnvars( p->pSat2, p->nSatVars );
    else if ( p->pSat3 )
    {
        for ( i = bmcg_sat_solver_varnum(p->pSat3); i < p->nSatVars; i++ )
            bmcg_sat_solver_addvar( p->pSat3 );
    }
    else
        sat_solver_setnvars( p->pSat, p->nSatVars );
    return Lit;
}